

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O2

void __thiscall SFFile::TranslatePercussionPreset(SFFile *this,SFPreset *preset)

{
  SFBag *pSVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = (ulong)preset->BagIndex;
  lVar2 = uVar3 * 0xc;
  for (; uVar3 < preset[1].BagIndex; uVar3 = uVar3 + 1) {
    pSVar1 = this->PresetBags;
    if (((-1 < *(int *)((long)&pSVar1->Target + lVar2)) &&
        (-1 < (char)(&(pSVar1->KeyRange).Lo)[lVar2])) &&
       (-1 < (char)(&(pSVar1->VelRange).Lo)[lVar2])) {
      TranslatePercussionPresetZone(this,preset,(SFBag *)((long)&pSVar1->GenIndex + lVar2));
    }
    lVar2 = lVar2 + 0xc;
  }
  return;
}

Assistant:

void SFFile::TranslatePercussionPreset(SFPreset *preset)
{
	SFPerc perc;
	int i;
	bool has_global;
	
	perc.LoadOrder = preset->LoadOrder;
	i = preset->BagIndex;
	has_global = false;

	for (i = preset->BagIndex; i < (preset + 1)->BagIndex; ++i)
	{
		if (PresetBags[i].Target < 0)
		{ // This preset zone has no instrument.
			continue;
		}
		if (PresetBags[i].KeyRange.Lo > 127 || PresetBags[i].VelRange.Lo > 127)
		{ // This preset zone is inaccesible.
			continue;
		}
		TranslatePercussionPresetZone(preset, &PresetBags[i]);
	}
}